

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::ReplicateVisitor::internalVisit(ReplicateVisitor *this,StuntDouble *sd)

{
  double *pdVar1;
  undefined1 auVar2 [8];
  pointer this_00;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
  atomInfoList;
  Mat3x3d box;
  undefined1 local_98 [8];
  pointer psStack_90;
  shared_ptr<OpenMD::AtomData> local_78;
  Mat3x3d local_68;
  
  pdVar1 = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_98,(string *)sd);
  this_00 = psStack_90;
  auVar2 = local_98;
  psStack_90 = (pointer)0x0;
  local_98 = (undefined1  [8])0x0;
  if ((double *)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar1) {
    operator_delete((void *)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                            data_[0][0],
                    (long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  if (auVar2 == (undefined1  [8])0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar3 = (element_type *)__dynamic_cast(auVar2,&GenericData::typeinfo,&AtomData::typeinfo,0);
    peVar4 = (element_type *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((peVar3 != (element_type *)0x0) &&
       (peVar4 = peVar3, this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
      }
    }
    if (peVar4 != (element_type *)0x0) {
      Snapshot::getHmat(&local_68,this->info->sman_->currentSnapshot_);
      std::
      vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ::vector((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                *)local_98,&peVar4->data);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_78.super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      local_78.super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_01;
      replicate(this,(vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                      *)local_98,&local_78,&local_68);
      if (local_78.super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ::~vector((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                 *)local_98);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void ReplicateVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) { return; }
    } else {
      return;
    }

    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
    Mat3x3d box            = currSnapshot->getHmat();

    std::vector<std::shared_ptr<AtomInfo>> atomInfoList = atomData->getData();

    replicate(atomInfoList, atomData, box);
  }